

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_import.pb.cc
# Opt level: O2

void __thiscall proto2_unittest_import::ImportMessage::Clear(ImportMessage *this)

{
  (this->field_0)._impl_.d_ = 0;
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void ImportMessage::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest_import.ImportMessage)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.d_ = 0;
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}